

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

cio_error cio_eventloop_init(cio_eventloop *loop)

{
  int iVar1;
  int *piVar2;
  cio_error local_1c;
  cio_error err;
  cio_eventloop *loop_local;
  
  loop->num_events = 0;
  loop->event_counter = 0;
  loop->current_ev = (cio_event_notifier *)0x0;
  iVar1 = epoll_create1(0x80000);
  loop->epoll_fd = iVar1;
  if (loop->epoll_fd == -1) {
    piVar2 = __errno_location();
    loop_local._4_4_ = -*piVar2;
  }
  else {
    iVar1 = eventfd(0,0x800);
    (loop->stop_ev).fd = iVar1;
    if ((loop->stop_ev).fd == -1) {
      piVar2 = __errno_location();
      local_1c = -*piVar2;
    }
    else {
      local_1c = cio_linux_eventloop_add(loop,&loop->stop_ev);
      if (local_1c == CIO_SUCCESS) {
        local_1c = cio_linux_eventloop_register_read(loop,&loop->stop_ev);
        if (local_1c == CIO_SUCCESS) {
          return CIO_SUCCESS;
        }
        cio_linux_eventloop_remove(loop,&loop->stop_ev);
      }
      close((loop->stop_ev).fd);
    }
    close(loop->epoll_fd);
    loop_local._4_4_ = local_1c;
  }
  return loop_local._4_4_;
}

Assistant:

enum cio_error cio_eventloop_init(struct cio_eventloop *loop)
{
	enum cio_error err = CIO_SUCCESS;

	loop->num_events = 0;
	loop->event_counter = 0;
	loop->current_ev = NULL;

	loop->epoll_fd = epoll_create1(EPOLL_CLOEXEC);
	if (cio_unlikely(loop->epoll_fd == -1)) {
		return (enum cio_error)(-errno);
	}

	loop->stop_ev.fd = eventfd(0, EFD_NONBLOCK);
	if (cio_unlikely(loop->stop_ev.fd == -1)) {
		err = (enum cio_error)(-errno);
		goto eventfd_failed;
	}

	err = cio_linux_eventloop_add(loop, &loop->stop_ev);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto ev_add_failed;
	}

	err = cio_linux_eventloop_register_read(loop, &loop->stop_ev);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto ev_register_read_failed;
	}

	return CIO_SUCCESS;

ev_register_read_failed:
	cio_linux_eventloop_remove(loop, &loop->stop_ev);
ev_add_failed:
	close(loop->stop_ev.fd);
eventfd_failed:
	close(loop->epoll_fd);
	return err;
}